

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MPIChain.cpp
# Opt level: O2

void __thiscall
adios2::aggregator::MPIChain::Init
          (MPIChain *this,size_t numAggregators,size_t subStreams,Comm *parentComm)

{
  BufferSTL *this_00;
  BufferSTL *local_18;
  
  (this->super_MPIAggregator).m_NumAggregators = subStreams;
  if (subStreams == 0) {
    MPIAggregator::InitCommOnePerNode(&this->super_MPIAggregator,parentComm);
  }
  else {
    MPIAggregator::InitComm(&this->super_MPIAggregator,subStreams,parentComm);
    MPIAggregator::HandshakeRank(&this->super_MPIAggregator,0);
  }
  HandshakeLinks(this);
  if ((this->super_MPIAggregator).m_Rank < (this->super_MPIAggregator).m_Size) {
    this_00 = (BufferSTL *)operator_new(0x58);
    adios2::format::BufferSTL::BufferSTL(this_00);
    local_18 = this_00;
    std::
    vector<std::unique_ptr<adios2::format::Buffer,std::default_delete<adios2::format::Buffer>>,std::allocator<std::unique_ptr<adios2::format::Buffer,std::default_delete<adios2::format::Buffer>>>>
    ::emplace_back<adios2::format::BufferSTL*>
              ((vector<std::unique_ptr<adios2::format::Buffer,std::default_delete<adios2::format::Buffer>>,std::allocator<std::unique_ptr<adios2::format::Buffer,std::default_delete<adios2::format::Buffer>>>>
                *)&(this->super_MPIAggregator).m_Buffers,&local_18);
  }
  return;
}

Assistant:

void MPIChain::Init(const size_t numAggregators, const size_t subStreams,
                    helper::Comm const &parentComm)
{
    /* numAggregators ignored here as BP3/BP4 uses substreams = aggregators */
    m_NumAggregators = subStreams;
    if (subStreams > 0)
    {
        InitComm(subStreams, parentComm);
        HandshakeRank(0);
    }
    else
    {
        InitCommOnePerNode(parentComm);
    }

    HandshakeLinks();

    // add a receiving buffer except for the last rank (only sends)
    if (m_Rank < m_Size)
    {
        m_Buffers.emplace_back(new format::BufferSTL()); // just one for now
    }
}